

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlAttrPtr xmlGetPropNodeInternal(xmlNode *node,xmlChar *name,xmlChar *nsName,int useDTD)

{
  _xmlDoc *p_Var1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlAttributePtr pxVar5;
  xmlNsPtr *ppxVar6;
  xmlChar *prefix;
  xmlDoc *doc;
  _xmlDtd *dtd;
  xmlNsPtr *ppxVar7;
  xmlAttrPtr pxVar8;
  
  if (node == (xmlNode *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (name == (xmlChar *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (node->type != XML_ELEMENT_NODE) {
    return (xmlAttrPtr)0x0;
  }
  pxVar8 = node->properties;
  if (pxVar8 != (xmlAttrPtr)0x0) {
    if (nsName == (xmlChar *)0x0) {
      do {
        if ((pxVar8->ns == (xmlNs *)0x0) && (iVar2 = xmlStrEqual(pxVar8->name,name), iVar2 != 0)) {
          return pxVar8;
        }
        pxVar8 = pxVar8->next;
      } while (pxVar8 != (_xmlAttr *)0x0);
    }
    else {
      do {
        if ((pxVar8->ns != (xmlNs *)0x0) && (iVar2 = xmlStrEqual(pxVar8->name,name), iVar2 != 0)) {
          pxVar3 = pxVar8->ns->href;
          if (pxVar3 == nsName) {
            return pxVar8;
          }
          iVar2 = xmlStrEqual(pxVar3,nsName);
          if (iVar2 != 0) {
            return pxVar8;
          }
        }
        pxVar8 = pxVar8->next;
      } while (pxVar8 != (_xmlAttr *)0x0);
    }
  }
  if (useDTD == 0) {
    return (xmlAttrPtr)0x0;
  }
  p_Var1 = node->doc;
  if (p_Var1 == (_xmlDoc *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (p_Var1->intSubset == (_xmlDtd *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if ((node->ns == (xmlNs *)0x0) || (pxVar3 = node->ns->prefix, pxVar3 == (xmlChar *)0x0)) {
    pxVar3 = node->name;
    pxVar4 = (xmlChar *)0x0;
  }
  else {
    pxVar3 = xmlStrdup(pxVar3);
    pxVar3 = xmlStrcat(pxVar3,":");
    pxVar4 = xmlStrcat(pxVar3,node->name);
    pxVar3 = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) {
      return (xmlAttrPtr)0x0;
    }
  }
  if (nsName == (xmlChar *)0x0) {
    pxVar5 = xmlGetDtdQAttrDesc(p_Var1->intSubset,pxVar3,name,(xmlChar *)0x0);
    if (pxVar5 != (xmlAttributePtr)0x0) goto LAB_00182e9e;
    dtd = p_Var1->extSubset;
    if (dtd == (_xmlDtd *)0x0) {
LAB_00182f44:
      pxVar5 = (xmlAttributePtr)0x0;
      goto LAB_00182e9e;
    }
    prefix = (xmlChar *)0x0;
  }
  else {
    doc = (xmlDoc *)nsName;
    iVar2 = xmlStrEqual(nsName,(xmlChar *)"http://www.w3.org/XML/1998/namespace");
    if (iVar2 == 0) {
      ppxVar6 = xmlGetNsList(doc,node);
      if (ppxVar6 == (xmlNsPtr *)0x0) {
        if (pxVar4 == (xmlChar *)0x0) {
          return (xmlAttrPtr)0x0;
        }
        (*xmlFree)(pxVar4);
        return (xmlAttrPtr)0x0;
      }
      ppxVar7 = ppxVar6;
      while ((pxVar5 = (xmlAttributePtr)0x0, *ppxVar7 != (xmlNsPtr)0x0 &&
             ((iVar2 = xmlStrEqual((*ppxVar7)->href,nsName), iVar2 == 0 ||
              ((pxVar5 = xmlGetDtdQAttrDesc(p_Var1->intSubset,pxVar3,name,(*ppxVar7)->prefix),
               pxVar5 == (xmlAttributePtr)0x0 &&
               ((p_Var1->extSubset == (xmlDtdPtr)0x0 ||
                (pxVar5 = xmlGetDtdQAttrDesc(p_Var1->extSubset,pxVar3,name,(*ppxVar7)->prefix),
                pxVar5 == (xmlAttributePtr)0x0))))))))) {
        ppxVar7 = ppxVar7 + 1;
      }
      (*xmlFree)(ppxVar6);
      goto LAB_00182e9e;
    }
    pxVar5 = xmlGetDtdQAttrDesc(p_Var1->intSubset,pxVar3,name,"xml");
    if (pxVar5 != (xmlAttributePtr)0x0) goto LAB_00182e9e;
    dtd = p_Var1->extSubset;
    if (dtd == (_xmlDtd *)0x0) goto LAB_00182f44;
    prefix = "xml";
  }
  pxVar5 = xmlGetDtdQAttrDesc(dtd,pxVar3,name,prefix);
LAB_00182e9e:
  if (pxVar4 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar4);
  }
  if (pxVar5 == (xmlAttributePtr)0x0) {
    return (xmlAttrPtr)0x0;
  }
  if (pxVar5->defaultValue == (xmlChar *)0x0) {
    return (xmlAttrPtr)0x0;
  }
  return (xmlAttrPtr)pxVar5;
}

Assistant:

static xmlAttrPtr
xmlGetPropNodeInternal(const xmlNode *node, const xmlChar *name,
		       const xmlChar *nsName, int useDTD)
{
    xmlAttrPtr prop;

    /* Avoid unused variable warning if features are disabled. */
    (void) useDTD;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE) || (name == NULL))
	return(NULL);

    if (node->properties != NULL) {
	prop = node->properties;
	if (nsName == NULL) {
	    /*
	    * We want the attr to be in no namespace.
	    */
	    do {
		if ((prop->ns == NULL) && xmlStrEqual(prop->name, name)) {
		    return(prop);
		}
		prop = prop->next;
	    } while (prop != NULL);
	} else {
	    /*
	    * We want the attr to be in the specified namespace.
	    */
	    do {
		if ((prop->ns != NULL) && xmlStrEqual(prop->name, name) &&
		    ((prop->ns->href == nsName) ||
		     xmlStrEqual(prop->ns->href, nsName)))
		{
		    return(prop);
		}
		prop = prop->next;
	    } while (prop != NULL);
	}
    }

#ifdef LIBXML_TREE_ENABLED
    if (! useDTD)
	return(NULL);
    /*
     * Check if there is a default/fixed attribute declaration in
     * the internal or external subset.
     */
    if ((node->doc != NULL) && (node->doc->intSubset != NULL)) {
	xmlDocPtr doc = node->doc;
	xmlAttributePtr attrDecl = NULL;
	xmlChar *elemQName, *tmpstr = NULL;

	/*
	* We need the QName of the element for the DTD-lookup.
	*/
	if ((node->ns != NULL) && (node->ns->prefix != NULL)) {
	    tmpstr = xmlStrdup(node->ns->prefix);
	    tmpstr = xmlStrcat(tmpstr, BAD_CAST ":");
	    tmpstr = xmlStrcat(tmpstr, node->name);
	    if (tmpstr == NULL)
		return(NULL);
	    elemQName = tmpstr;
	} else
	    elemQName = (xmlChar *) node->name;
	if (nsName == NULL) {
	    /*
	    * The common and nice case: Attr in no namespace.
	    */
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset,
		elemQName, name, NULL);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL)) {
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset,
		    elemQName, name, NULL);
	    }
        } else if (xmlStrEqual(nsName, XML_XML_NAMESPACE)) {
	    /*
	    * The XML namespace must be bound to prefix 'xml'.
	    */
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset,
		elemQName, name, BAD_CAST "xml");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL)) {
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset,
		    elemQName, name, BAD_CAST "xml");
	    }
	} else {
	    xmlNsPtr *nsList, *cur;

	    /*
	    * The ugly case: Search using the prefixes of in-scope
	    * ns-decls corresponding to @nsName.
	    */
	    nsList = xmlGetNsList(node->doc, node);
	    if (nsList == NULL) {
		if (tmpstr != NULL)
		    xmlFree(tmpstr);
		return(NULL);
	    }
	    cur = nsList;
	    while (*cur != NULL) {
		if (xmlStrEqual((*cur)->href, nsName)) {
		    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elemQName,
			name, (*cur)->prefix);
		    if (attrDecl)
			break;
		    if (doc->extSubset != NULL) {
			attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elemQName,
			    name, (*cur)->prefix);
			if (attrDecl)
			    break;
		    }
		}
		cur++;
	    }
	    xmlFree(nsList);
	}
	if (tmpstr != NULL)
	    xmlFree(tmpstr);
	/*
	* Only default/fixed attrs are relevant.
	*/
	if ((attrDecl != NULL) && (attrDecl->defaultValue != NULL))
	    return((xmlAttrPtr) attrDecl);
    }
#endif /* LIBXML_TREE_ENABLED */
    return(NULL);
}